

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O3

void CATCH2_INTERNAL_TEST_8(void)

{
  return_handler<bool_(int)> *prVar1;
  bool bVar2;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_28,_int>_conflict mVar3;
  return_handler<bool_(int)> *prVar4;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_27,_int>_conflict mVar5;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_30,_int>_conflict mVar6;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_29,_int>_conflict mVar7;
  trompeloeil_l_expectation_list_t_30 *this;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  AssertionHandler catchAssertionHandler;
  BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
  composedFun;
  call_matcher<bool_(int),_std::tuple<int>_> *local_4d0;
  long *local_4c8;
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> local_4c0;
  int local_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [64];
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *local_450;
  Section local_3d0;
  GenericOperation1Mock<bool,_int> local_370;
  type<std::remove_cvref_t<Composition<ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>_>_>
  local_2b0;
  GenericOperation1Mock<bool,_int> local_130;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_130.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_27.saturated;
  local_130.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_28;
  local_130.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_28.saturated;
  local_130.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_29;
  local_130.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_29.saturated;
  local_130.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_4a0._8_8_ = &local_130.trompeloeil_l_expectations_30;
  local_130.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_130.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_130.trompeloeil_l_expectations_30.saturated;
  local_130.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_370;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_27.saturated;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28.saturated;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29.saturated;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  this = &local_370.trompeloeil_l_expectations_30;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_30.saturated;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f1a50;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_27.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_130;
  local_130.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_130;
  local_130.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_130.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0._8_8_;
  local_130.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0._8_8_;
  local_130.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_130.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_4a0._0_8_ = operator_new(0x18);
  ((__uniq_ptr_data<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>,_true,_true>
    *)(local_4a0._0_8_ + 8))->
  super___uniq_ptr_impl<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
       = (__uniq_ptr_impl<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
          )local_4a0._0_8_;
  ((__uniq_ptr_data<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>,_true,_true>
    *)(local_4a0._0_8_ + 0x10))->
  super___uniq_ptr_impl<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
       = (__uniq_ptr_impl<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
          )local_4a0._0_8_;
  *(undefined ***)local_4a0._0_8_ = &PTR__list_004f1dd8;
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46108a;
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4b;
  Catch::StringRef::StringRef(&local_40,"Invoking as const lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_2b0,local_40,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4d;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b7fe;
    local_4c0.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
         CONCAT44(local_4c0.prev._4_4_,0x2a);
    local_4c0._vptr_list_elem = (_func_int **)&local_130;
    mVar3 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&local_2b0,(int *)&local_4c0.prev);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f53b0;
    prVar1 = ((mVar3.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar3.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar3.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar3.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4c0);
    local_4c0._vptr_list_elem = (_func_int **)&local_370;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x51;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b820;
    local_4a4 = 0x2a;
    mVar3 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&local_2b0,&local_4a4);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f53f0;
    prVar1 = ((mVar3.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar3.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar3.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4c0.prev = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)mVar3;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_130);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_2b0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT44(local_4c0._vptr_list_elem._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_const_GenericOperation1Mock<bool,_int>_&,_const_GenericOperation1Mock<bool,_int>_&>
                      (local_490,
                       &local_2b0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_2b0);
    local_4c0._vptr_list_elem = (_func_int **)0x46108a;
    local_4c0.next = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5a;
    macroName.m_size = 7;
    macroName.m_start = "REQUIRE";
    capturedExpression.m_size = 7;
    capturedExpression.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName,(SourceLineInfo *)&local_4c0,
               capturedExpression,Normal);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT71(local_4c0._vptr_list_elem._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_2b0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46108a;
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5d;
  Catch::StringRef::StringRef(&local_50,"Invoking as lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_2b0,local_50,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5f;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b85b;
    local_4c0.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
         CONCAT44(local_4c0.prev._4_4_,0x2a);
    local_4c0._vptr_list_elem = (_func_int **)&local_130;
    mVar5 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_27 *)&local_2b0,(int *)&local_4c0.prev);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f5430;
    prVar1 = ((mVar5.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar5.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar5.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar5.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4c0);
    local_4c0._vptr_list_elem = (_func_int **)&local_370;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x63;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b877;
    local_4a4 = 0x2a;
    mVar5 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>((trompeloeil_l_tag_type_trompeloeil_27 *)&local_2b0,&local_4a4);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f5470;
    prVar1 = ((mVar5.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar5.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar5.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4c0.prev = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)mVar5;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_130);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_2b0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT44(local_4c0._vptr_list_elem._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_GenericOperation1Mock<bool,_int>_&,_GenericOperation1Mock<bool,_int>_&>
                      (local_490,
                       &local_2b0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_2b0);
    local_4c0._vptr_list_elem = (_func_int **)0x46108a;
    local_4c0.next = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x6c;
    macroName_00.m_size = 7;
    macroName_00.m_start = "REQUIRE";
    capturedExpression_00.m_size = 7;
    capturedExpression_00.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_00,(SourceLineInfo *)&local_4c0,
               capturedExpression_00,Normal);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT71(local_4c0._vptr_list_elem._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_2b0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46108a;
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x6f;
  Catch::StringRef::StringRef(&local_60,"Invoking as const rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_2b0,local_60,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x71;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b8b2;
    local_4c0.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
         CONCAT44(local_4c0.prev._4_4_,0x2a);
    local_4c0._vptr_list_elem = (_func_int **)&local_130;
    mVar6 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
            call_const_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_30 *)&local_2b0,(int *)&local_4c0.prev);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f54b0;
    prVar1 = ((mVar6.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar6.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar6.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar6.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4c0);
    local_4c0._vptr_list_elem = (_func_int **)&local_370;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x75;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b8d4;
    local_4a4 = 0x2a;
    mVar6 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
            call_const_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_30 *)&local_2b0,&local_4a4);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f54f0;
    prVar1 = ((mVar6.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar6.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar6.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4c0.prev = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)mVar6;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_130);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_2b0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT44(local_4c0._vptr_list_elem._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_const_GenericOperation1Mock<bool,_int>,_const_GenericOperation1Mock<bool,_int>_>
                      (local_490,
                       &local_2b0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_2b0);
    local_4c0._vptr_list_elem = (_func_int **)0x46108a;
    local_4c0.next = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x7e;
    macroName_01.m_size = 7;
    macroName_01.m_start = "REQUIRE";
    capturedExpression_01.m_size = 7;
    capturedExpression_01.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_01,(SourceLineInfo *)&local_4c0,
               capturedExpression_01,Normal);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT71(local_4c0._vptr_list_elem._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_2b0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46108a;
  local_2b0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x81;
  Catch::StringRef::StringRef(&local_70,"Invoking as rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_2b0,local_70,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x83;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b90f;
    local_4c0.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
         CONCAT44(local_4c0.prev._4_4_,0x2a);
    local_4c0._vptr_list_elem = (_func_int **)&local_130;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
            call_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_29 *)&local_2b0,(int *)&local_4c0.prev);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f5530;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar7.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4c0);
    local_4c0._vptr_list_elem = (_func_int **)&local_370;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46108a;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x87;
    local_2b0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45b92b;
    local_4a4 = 0x2a;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
            call_rvalue_ref<int>((trompeloeil_l_tag_type_trompeloeil_29 *)&local_2b0,&local_4a4);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004f5570;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)local_4a0;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4c0.prev = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)mVar7;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_130);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_2b0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT44(local_4c0._vptr_list_elem._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                      (local_490,
                       &local_2b0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_2b0);
    local_4c0._vptr_list_elem = (_func_int **)0x46108a;
    local_4c0.next = (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x90;
    macroName_02.m_size = 7;
    macroName_02.m_start = "REQUIRE";
    capturedExpression_02.m_size = 7;
    capturedExpression_02.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_02,(SourceLineInfo *)&local_4c0,
               capturedExpression_02,Normal);
    local_4c0._vptr_list_elem = (_func_int **)CONCAT71(local_4c0._vptr_list_elem._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_2b0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  std::unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>::
  ~unique_ptr((unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
               *)local_4a0);
  trompeloeil::expectations<true,_bool_(int)>::~expectations(this);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_29);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_28);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_27);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            ((expectations<true,_bool_(int)> *)local_4a0._8_8_);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_130.trompeloeil_l_expectations_29);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_130.trompeloeil_l_expectations_28);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_130.trompeloeil_l_expectations_27);
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }